

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O3

Reals __thiscall
Omega_h::tri_vert_normal_weights(Omega_h *this,Mesh *mesh,Adj *surf_verts2tris,LOs *tri2surf_tri)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  Alloc *pAVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Alloc *pAVar10;
  bool bVar11;
  bool bVar12;
  Int i_2;
  LO LVar13;
  LO size_in;
  long lVar14;
  Alloc **ppAVar15;
  int iVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  char cVar18;
  uint uVar19;
  long lVar20;
  undefined8 *puVar21;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar22;
  long lVar23;
  long lVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Reals RVar27;
  IntIterator last;
  Write<double> weights;
  Reals coords;
  LOs fv2v;
  Few<int,_3> ffv2v;
  Matrix<3,_2> b;
  type func;
  Vector<3> c;
  Matrix<3,_3> ffv2p;
  element_type *local_2d8;
  undefined1 auStack_2d0 [24];
  Alloc *local_2b8;
  undefined1 auStack_2b0 [24];
  Write<double> local_298;
  Alloc *local_280;
  Write<double> local_278;
  Alloc *local_268;
  element_type *local_260;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  element_type *local_250;
  string local_248;
  Alloc *local_228;
  Alloc *local_220;
  Alloc *local_218;
  Alloc *local_210;
  Alloc *local_208;
  Alloc *local_200;
  Alloc *local_1f8;
  element_type *local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  Alloc *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  Alloc *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  Alloc *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  Alloc *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  Alloc *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  Alloc *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  Alloc *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  element_type *local_158;
  undefined4 local_150;
  element_type *local_148;
  undefined4 local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  element_type *peStack_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  Alloc *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  Alloc *local_c8;
  Alloc *local_c0;
  Alloc *local_b8;
  Alloc *local_b0;
  element_type *local_a8;
  Alloc *local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Alloc *pAStack_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  Alloc *local_78 [3];
  undefined8 local_60 [3];
  undefined8 local_48 [3];
  
  LVar13 = Graph::nnodes(&surf_verts2tris->super_Graph);
  Mesh::ask_verts_of((Mesh *)&local_258,(Int)mesh);
  Mesh::coords((Mesh *)&local_268);
  size_in = Graph::nedges(&surf_verts2tris->super_Graph);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
  Write<double>::Write(&local_298,size_in,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,(ulong)(local_248.field_2._M_allocated_capacity + 1))
    ;
  }
  pvVar22 = local_298.shared_alloc_.direct_ptr;
  local_100._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (surf_verts2tris->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_100._M_pi & 7) == 0 && (Alloc *)local_100._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (((Alloc *)local_100._M_pi)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_100._M_pi)->use_count = ((Alloc *)local_100._M_pi)->use_count + 1;
    }
  }
  peVar4 = (element_type *)(surf_verts2tris->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_f0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (surf_verts2tris->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_f0._M_pi & 7) == 0 && (Alloc *)local_f0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_f0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_f0._M_pi)->use_count = ((Alloc *)local_f0._M_pi)->use_count + 1;
    }
  }
  peVar5 = (element_type *)(surf_verts2tris->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (surf_verts2tris->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_e0._M_pi & 7) == 0 && (Alloc *)local_e0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_e0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_e0._M_pi)->use_count = ((Alloc *)local_e0._M_pi)->use_count + 1;
    }
  }
  local_280 = (Alloc *)(surf_verts2tris->codes).write_.shared_alloc_.direct_ptr;
  local_d0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(tri2surf_tri->write_).shared_alloc_.alloc;
  if (((ulong)local_d0._M_pi & 7) == 0 && (Alloc *)local_d0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_d0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_d0._M_pi)->use_count = ((Alloc *)local_d0._M_pi)->use_count + 1;
    }
  }
  pAVar6 = (Alloc *)(tri2surf_tri->write_).shared_alloc_.direct_ptr;
  local_c0 = local_298.shared_alloc_.alloc;
  if (((ulong)local_298.shared_alloc_.alloc & 7) == 0 &&
      local_298.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (Alloc *)((local_298.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_298.shared_alloc_.alloc)->use_count = (local_298.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b8 = (Alloc *)local_298.shared_alloc_.direct_ptr;
  local_b0 = (Alloc *)local_258._M_pi;
  if (((ulong)local_258._M_pi & 7) == 0 && (Alloc *)local_258._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)((long)(local_258._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_258._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_258._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a8 = local_250;
  local_a0 = local_268;
  if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_268->size * 8 + 1);
    }
    else {
      local_268->use_count = local_268->use_count + 1;
    }
  }
  local_98 = local_260;
  local_1d8 = (Alloc *)local_100._M_pi;
  if (((ulong)local_100._M_pi & 7) == 0 && (Alloc *)local_100._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (Alloc *)((long)(local_100._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_100._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_100._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_1c8 = (Alloc *)local_f0._M_pi;
  if (((ulong)local_f0._M_pi & 7) == 0 && (Alloc *)local_f0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)((long)(local_f0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_f0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_f0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_1b8 = (Alloc *)local_e0._M_pi;
  if (((ulong)local_e0._M_pi & 7) == 0 && (Alloc *)local_e0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)((long)(local_e0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_e0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_e0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_1a8 = (Alloc *)local_d0._M_pi;
  if (((ulong)local_d0._M_pi & 7) == 0 && (Alloc *)local_d0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)((long)(local_d0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_d0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_d0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_198 = local_c0;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  _Stack_190._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.shared_alloc_.direct_ptr;
  local_188 = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250;
  local_178 = local_a0;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260;
  _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar6;
  local_f8 = peVar4;
  local_e8 = peVar5;
  local_d8 = local_280;
  local_c8 = pAVar6;
  if (0 < LVar13) {
    local_248._M_dataplus._M_p = (pointer)local_1d8;
    if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
      local_1d8->use_count = local_1d8->use_count + -1;
      local_248._M_dataplus._M_p = (pointer)(local_1d8->size * 8 + 1);
    }
    local_1d8 = (Alloc *)0x0;
    _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_248.field_2._M_allocated_capacity = (size_type)local_1c8;
    if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
      local_1c8->use_count = local_1c8->use_count + -1;
      local_248.field_2._M_allocated_capacity = local_1c8->size * 8 + 1;
    }
    local_1c8 = (Alloc *)0x0;
    _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228 = local_1b8;
    if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
      local_1b8->use_count = local_1b8->use_count + -1;
      local_228 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    local_1b8 = (Alloc *)0x0;
    _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218 = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      local_1a8->use_count = local_1a8->use_count + -1;
      local_218 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    local_1a8 = (Alloc *)0x0;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_200 = (Alloc *)local_298.shared_alloc_.direct_ptr;
    local_208 = local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      local_198->use_count = local_198->use_count + -1;
      local_208 = (Alloc *)(local_198->size * 8 + 1);
    }
    local_198 = (Alloc *)0x0;
    _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f0 = local_250;
    local_1f8 = local_188;
    if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
      local_188->use_count = local_188->use_count + -1;
      local_1f8 = (Alloc *)(local_188->size * 8 + 1);
    }
    local_188 = (Alloc *)0x0;
    _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e0 = local_260;
    local_1e8 = local_178;
    if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
      local_178->use_count = local_178->use_count + -1;
      local_1e8 = (Alloc *)(local_178->size * 8 + 1);
    }
    local_178 = (Alloc *)0x0;
    _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    lVar24 = 0;
    local_248._M_string_length = (size_type)peVar4;
    local_248.field_2._8_8_ = peVar5;
    local_220 = local_280;
    local_210 = pAVar6;
    local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    do {
      iVar3 = *(int *)((long)&(peVar4->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar24 * 4);
      lVar23 = (long)iVar3;
      iVar16 = *(int *)((long)&(peVar4->super_Graph).a2ab.write_.shared_alloc_.alloc +
                       lVar24 * 4 + 4);
      if (iVar3 < iVar16) {
        do {
          lVar14 = (long)*(int *)((long)&(peVar5->super_Graph).a2ab.write_.shared_alloc_.alloc +
                                 lVar23 * 4);
          if (*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                              &pAVar6->size)->_M_ptr + lVar14 * 4) < 0) {
            (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)pvVar22)->_M_ptr)
            [lVar23] = (element_type *)0x0;
          }
          else {
            cVar18 = '\x03' - (*(char *)((long)&(((Graph *)&local_280->size)->a2ab).write_.
                                                shared_alloc_.alloc + lVar23) >> 3);
            uVar19 = cVar18 * 0x56;
            local_148 = *(element_type **)((long)&local_250->library_ + lVar14 * 0xc);
            local_140 = *(undefined4 *)
                         ((long)&(local_250->srcs_).write_.shared_alloc_.alloc + lVar14 * 0xc);
            lVar14 = 0;
            do {
              *(undefined4 *)
               ((long)&local_158 +
               (long)(((int)(char)(cVar18 + ((char)((uVar19 & 0xffff) >> 0xf) + (char)(uVar19 >> 8))
                                            * -3) + (int)lVar14) % 3) * 4) =
                   *(undefined4 *)((long)&local_148 + lVar14 * 4);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158;
            uStack_130 = local_150;
            ppAVar15 = local_78;
            lVar14 = 0;
            do {
              lVar20 = (long)*(int *)((long)&local_138._M_pi + lVar14 * 4);
              ppAVar15[2] = (Alloc *)(&((string *)&local_260->srcs_)->_M_string_length)[lVar20 * 3];
              puVar21 = (undefined8 *)((long)&local_260->library_ + lVar20 * 0x18);
              pAVar10 = (Alloc *)puVar21[1];
              *ppAVar15 = (Alloc *)*puVar21;
              ppAVar15[1] = pAVar10;
              lVar14 = lVar14 + 1;
              ppAVar15 = ppAVar15 + 3;
            } while (lVar14 != 3);
            p_Var17 = &local_138;
            puVar21 = local_60;
            bVar11 = true;
            do {
              bVar12 = bVar11;
              auStack_2d0._8_8_ = puVar21[2];
              local_2d8 = (element_type *)*puVar21;
              auStack_2d0._0_16_ = *(undefined1 (*) [16])(puVar21 + 1);
              local_2b8 = local_78[0];
              lVar14 = 0;
              do {
                (&local_90)[lVar14]._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (*(double *)(auStack_2d0 + lVar14 * 8 + -8) -
                     *(double *)(auStack_2b0 + lVar14 * 8 + -8));
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              p_Var17[2]._M_pi = local_80;
              p_Var17->_M_pi = local_90._M_pi;
              p_Var17[1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_88;
              p_Var17 = &local_120;
              puVar21 = local_48;
              bVar11 = false;
            } while (bVar12);
            dVar7 = (double)CONCAT44(uStack_12c,uStack_130) * (double)local_110._M_pi -
                    (double)peStack_118 * (double)local_128;
            dVar8 = (double)local_128 * (double)local_120._M_pi -
                    (double)local_110._M_pi * (double)local_138._M_pi;
            dVar9 = (double)local_138._M_pi * (double)peStack_118 -
                    (double)local_120._M_pi * (double)CONCAT44(uStack_12c,uStack_130);
            uVar25 = SUB84(dVar9,0);
            uVar26 = (undefined4)((ulong)dVar9 >> 0x20);
            auStack_2b0._8_4_ = uVar25;
            auStack_2b0._0_8_ = dVar8;
            auStack_2b0._12_4_ = uVar26;
            auStack_2d0._8_4_ = uVar25;
            auStack_2d0._0_8_ = dVar8;
            auStack_2d0._12_4_ = uVar26;
            dVar7 = dVar7 * dVar7;
            lVar14 = 1;
            do {
              dVar7 = dVar7 + *(double *)(auStack_2d0 + lVar14 * 8 + -8) *
                              *(double *)(auStack_2b0 + lVar14 * 8 + -8);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_2b8 = (Alloc *)local_138._M_pi;
            auStack_2b0._8_8_ = local_128;
            auStack_2b0._0_8_ = CONCAT44(uStack_12c,uStack_130);
            local_2d8 = (element_type *)local_138._M_pi;
            auStack_2d0._8_8_ = local_128;
            auStack_2d0._0_8_ = CONCAT44(uStack_12c,uStack_130);
            dVar8 = (double)local_138._M_pi * (double)local_138._M_pi;
            lVar14 = 1;
            do {
              dVar8 = dVar8 + *(double *)(auStack_2d0 + lVar14 * 8 + -8) *
                              *(double *)(auStack_2b0 + lVar14 * 8 + -8);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_2b8 = (Alloc *)local_120._M_pi;
            local_2d8 = (element_type *)local_120._M_pi;
            auStack_2d0._8_8_ = local_110._M_pi;
            auStack_2d0._0_8_ = peStack_118;
            dVar9 = (double)local_120._M_pi * (double)local_120._M_pi;
            lVar14 = 1;
            do {
              dVar9 = dVar9 + *(double *)(auStack_2d0 + lVar14 * 8 + -8) *
                              *(double *)(auStack_2b0 + lVar14 * 8 + -8);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)pvVar22)->_M_ptr)
            [lVar23] = (element_type *)(dVar7 / (dVar8 * dVar9));
            iVar16 = *(int *)((long)&(peVar4->super_Graph).a2ab.write_.shared_alloc_.alloc +
                             lVar24 * 4 + 4);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar16);
      }
      lVar24 = lVar24 + 1;
    } while (LVar13 != (int)lVar24);
    tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&local_248);
    this = (Omega_h *)local_160._M_pi;
  }
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_1d8);
  local_278.shared_alloc_.alloc = local_298.shared_alloc_.alloc;
  local_278.shared_alloc_.direct_ptr = local_298.shared_alloc_.direct_ptr;
  if ((((ulong)local_298.shared_alloc_.alloc & 7) == 0 &&
       local_298.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_298.shared_alloc_.alloc)->use_count = (local_298.shared_alloc_.alloc)->use_count + -1;
    local_278.shared_alloc_.alloc = (Alloc *)((local_298.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_298.shared_alloc_.alloc = (Alloc *)0x0;
  local_298.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_278);
  pAVar6 = local_278.shared_alloc_.alloc;
  if (((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
      local_278.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_278.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_100);
  pAVar6 = local_298.shared_alloc_.alloc;
  pvVar22 = extraout_RDX;
  if (((ulong)local_298.shared_alloc_.alloc & 7) == 0 &&
      local_298.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_298.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
      pvVar22 = extraout_RDX_00;
    }
  }
  if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
    piVar1 = &local_268->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268);
      operator_delete(local_268,0x48);
      pvVar22 = extraout_RDX_01;
    }
  }
  if (((ulong)local_258._M_pi & 7) == 0 && (Alloc *)local_258._M_pi != (Alloc *)0x0) {
    p_Var2 = local_258._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_258._M_pi);
      operator_delete(local_258._M_pi,0x48);
      pvVar22 = extraout_RDX_02;
    }
  }
  RVar27.write_.shared_alloc_.direct_ptr = pvVar22;
  RVar27.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar27.write_.shared_alloc_;
}

Assistant:

Reals tri_vert_normal_weights(
    Mesh* mesh, Adj surf_verts2tris, LOs tri2surf_tri) {
  auto nsurf_verts = surf_verts2tris.nnodes();
  auto fv2v = mesh->ask_verts_of(FACE);
  auto coords = mesh->coords();
  auto nweights = surf_verts2tris.nedges();
  auto weights = Write<Real>(nweights);
  auto func = OMEGA_H_LAMBDA(LO surf_vert) {
    for (auto vf = surf_verts2tris.a2ab[surf_vert];
         vf < surf_verts2tris.a2ab[surf_vert + 1]; ++vf) {
      auto f = surf_verts2tris.ab2b[vf];
      if (tri2surf_tri[f] < 0) {
        weights[vf] = 0.0;
        continue;
      }
      auto code = surf_verts2tris.codes[vf];
      auto ffv = code_which_down(code);
      auto rot = rotation_to_first(3, ffv);
      auto ffv2v_0 = gather_verts<3>(fv2v, f);
      Few<LO, 3> ffv2v;
      rotate_adj<3>(rot, ffv2v_0, 0, ffv2v, 0);
      auto ffv2p = gather_vectors<3, 3>(coords, ffv2v);
      auto b = simplex_basis<3, 2>(ffv2p);
      auto w =
          norm(cross(b[0], b[1])) / (norm_squared(b[0]) * norm_squared(b[1]));
      weights[vf] = w;
    }
  };
  parallel_for(nsurf_verts, func, "tri_vert_normal_weights");
  return weights;
}